

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

bool __thiscall
glslang::TIntermediate::isIntegralPromotion(TIntermediate *this,TBasicType from,TBasicType to)

{
  TBasicType to_local;
  TBasicType from_local;
  TIntermediate *this_local;
  
  if ((to == EbtInt) && (from - EbtInt8 < 4)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TIntermediate::isIntegralPromotion(TBasicType from, TBasicType to) const
{
    // integral promotions
    if (to == EbtInt) {
        switch(from) {
        case EbtInt8:
        case EbtInt16:
        case EbtUint8:
        case EbtUint16:
            return true;
        default:
            break;
        }
    }
    return false;
}